

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  ulong uVar1;
  uint i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float in_XMM6_Da;
  float in_XMM6_Db;
  float fVar17;
  undefined4 in_XMM6_Dc;
  undefined4 in_XMM6_Dd;
  float fVar18;
  undefined1 auVar19 [16];
  double weightedDotProducts [64];
  float afStack_308 [64];
  double adStack_208 [64];
  
  uVar1 = (ulong)size;
  if (size == 0) {
    dVar7 = 0.0;
    fVar15 = 0.0;
    fVar14 = 0.0;
  }
  else {
    fVar15 = 0.0;
    dVar7 = 0.0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar6 = (*weights)[uVar4];
      fVar10 = (float)uVar6;
      fVar14 = (*vectors)[uVar4].m_s[0];
      fVar13 = fVar14 * fVar10;
      afStack_308[uVar4] = fVar13;
      fVar15 = fVar15 + fVar13;
      uVar3 = uVar3 + uVar6;
      dVar11 = (double)(fVar14 * fVar14 * fVar10);
      adStack_208[uVar4] = dVar11;
      dVar7 = dVar7 + dVar11;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if ((long)uVar3 < 0) {
      fVar14 = (float)uVar3;
    }
    else {
      fVar14 = (float)(long)uVar3;
    }
  }
  fVar10 = 1.0;
  fVar13 = (1.0 / fVar14) * fVar15;
  (*result)[1].m_s[0] = fVar13;
  (*result)[0].m_s[0] = fVar13;
  if (size == 1) {
    return;
  }
  fVar15 = (float)(dVar7 - (double)((fVar15 * fVar15) / fVar14));
  auVar8 = ZEXT416((uint)fVar15);
  if (fVar15 <= 0.0) {
    return;
  }
  if (size != 0) {
    dVar7 = -1.0;
    uVar3 = 0;
    do {
      fVar15 = (*vectors)[uVar3].m_s[0];
      auVar8 = ZEXT416((uint)fVar15);
      fVar15 = fVar15 - fVar13;
      dVar11 = (double)(fVar15 * fVar15 + 0.0);
      if (dVar11 <= dVar7) {
        auVar8._4_4_ = in_XMM6_Db;
        auVar8._0_4_ = in_XMM6_Da;
        auVar8._8_4_ = in_XMM6_Dc;
        auVar8._12_4_ = in_XMM6_Dd;
        dVar11 = dVar7;
      }
      dVar7 = dVar11;
      uVar3 = uVar3 + 1;
      in_XMM6_Da = auVar8._0_4_;
      in_XMM6_Db = auVar8._4_4_;
      in_XMM6_Dc = auVar8._8_4_;
      in_XMM6_Dd = auVar8._12_4_;
    } while (uVar1 != uVar3);
    if (size != 0) {
      uVar3 = 0;
      fVar15 = -1.0;
      do {
        fVar16 = (*vectors)[uVar3].m_s[0];
        fVar17 = 0.0;
        fVar18 = (fVar16 - in_XMM6_Da) * (fVar16 - in_XMM6_Da) + 0.0;
        if (fVar18 <= fVar15) {
          fVar16 = SUB84(dVar7,0);
          fVar17 = (float)((ulong)dVar7 >> 0x20);
          fVar18 = fVar15;
        }
        uVar3 = uVar3 + 1;
        dVar7 = (double)CONCAT44(fVar17,fVar16);
        fVar15 = fVar18;
      } while (uVar1 != uVar3);
      auVar9._0_4_ = (in_XMM6_Da + fVar13) * 0.5;
      auVar9._4_4_ = (fVar16 + fVar13) * 0.5;
      auVar9._8_4_ = (in_XMM6_Db + fVar13) * 0.0;
      auVar9._12_4_ = (fVar17 + fVar13) * 0.0;
      if (2 < size) {
        fVar15 = 0.0;
        uVar3 = 0;
        do {
          fVar16 = (*vectors)[uVar3].m_s[0] - fVar13;
          fVar15 = fVar15 + (float)(*weights)[uVar3] * fVar16 * fVar16;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        iVar2 = 10;
        do {
          fVar10 = fVar10 * (fVar15 / fVar14);
          fVar16 = fVar10 + 0.0;
          uVar6 = -(uint)(fVar10 != 0.0);
          fVar10 = (float)(uVar6 & (uint)((1.0 / fVar16) * fVar16) | ~uVar6 & (uint)fVar16);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        uVar6 = -(uint)(fVar10 * fVar10 != 0.0);
        auVar12 = ZEXT816(0);
        uVar3 = 0;
        fVar15 = 0.0;
        fVar14 = 0.0;
        do {
          fVar16 = fVar14;
          if (0.0 <= ((*vectors)[uVar3].m_s[0] - fVar13) *
                     (float)(~uVar6 & (uint)fVar10 |
                            (uint)((1.0 / SQRT(fVar10 * fVar10)) * fVar10) & uVar6)) {
            fVar14 = fVar16 + afStack_308[uVar3];
            auVar12._8_8_ = auVar12._8_8_ + (double)(*weights)[uVar3];
          }
          else {
            fVar15 = fVar15 + afStack_308[uVar3];
            auVar12._0_8_ = auVar12._0_8_ + (double)(*weights)[uVar3];
            fVar14 = fVar16;
          }
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        if ((0.0 < auVar12._0_8_) && (0.0 < auVar12._8_8_)) {
          auVar8 = divpd(_DAT_001b0730,auVar12);
          auVar9._4_4_ = fVar14 * (float)auVar8._8_8_;
          auVar9._0_4_ = fVar15 * (float)auVar8._0_8_;
          auVar9._8_4_ = fVar16 * 0.0;
          auVar9._12_4_ = fVar16 * 0.0;
        }
      }
      goto LAB_0017f039;
    }
  }
  auVar9._4_4_ = NAN;
  auVar9._0_4_ = (fVar13 + auVar8._0_4_) * 0.5;
  auVar9._8_8_ = 0;
LAB_0017f039:
  iVar2 = 0;
  fVar14 = 1e+10;
  do {
    if (size == 0) {
      return;
    }
    dVar7 = 0.0;
    uVar3 = 0;
    dVar11 = 0.0;
    uVar4 = 0;
    uVar5 = 0;
    fVar10 = 0.0;
    fVar15 = 0.0;
    do {
      fVar13 = fVar15;
      fVar15 = (*vectors)[uVar3].m_s[0];
      fVar16 = auVar9._0_4_ - fVar15;
      fVar15 = auVar9._4_4_ - fVar15;
      if (fVar15 * fVar15 + 0.0 <= fVar16 * fVar16 + 0.0) {
        fVar15 = fVar13 + afStack_308[uVar3];
        dVar7 = dVar7 + adStack_208[uVar3];
        uVar4 = uVar4 + (*weights)[uVar3];
      }
      else {
        fVar10 = fVar10 + afStack_308[uVar3];
        dVar11 = dVar11 + adStack_208[uVar3];
        uVar5 = uVar5 + (*weights)[uVar3];
        fVar15 = fVar13;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    if (uVar5 == 0) {
      return;
    }
    if (uVar4 == 0) {
      return;
    }
    auVar19._0_4_ = (float)uVar5;
    auVar19._4_4_ = (float)uVar4;
    auVar19._8_8_ = 0;
    auVar8 = divps(_DAT_001a76f0,auVar19);
    fVar16 = (float)(dVar7 - (double)((fVar15 * fVar15) / (float)uVar4)) +
             (float)(dVar11 - (double)((fVar10 * fVar10) / auVar19._0_4_));
    auVar9._0_4_ = auVar8._0_4_ * fVar10;
    auVar9._4_4_ = auVar8._4_4_ * fVar15;
    auVar9._8_4_ = auVar8._8_4_ * fVar13;
    auVar9._12_4_ = auVar8._12_4_ * fVar13;
  } while (((1e-05 <= fVar16) && (1e-05 <= (fVar14 - fVar16) / fVar16)) &&
          (iVar2 = iVar2 + 1, fVar14 = fVar16, iVar2 != 0x400));
  (*result)[0].m_s[0] = auVar9._0_4_;
  (*result)[1].m_s[0] = auVar9._4_4_;
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }